

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O0

SUNNonlinearSolver SUNNonlinSol_Newton(N_Vector y,SUNContext_conflict sunctx)

{
  SUNNonlinearSolver p_Var1;
  undefined8 *__s;
  undefined8 uVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  SUNNonlinearSolverContent_Newton content;
  SUNNonlinearSolver NLS;
  SUNContext_conflict sunctx_local_scope_;
  
  p_Var1 = (SUNNonlinearSolver)SUNNonlinSolNewEmpty(in_RSI);
  p_Var1->ops->gettype = SUNNonlinSolGetType_Newton;
  p_Var1->ops->initialize = SUNNonlinSolInitialize_Newton;
  p_Var1->ops->solve = SUNNonlinSolSolve_Newton;
  p_Var1->ops->free = SUNNonlinSolFree_Newton;
  p_Var1->ops->setsysfn = SUNNonlinSolSetSysFn_Newton;
  p_Var1->ops->setlsetupfn = SUNNonlinSolSetLSetupFn_Newton;
  p_Var1->ops->setlsolvefn = SUNNonlinSolSetLSolveFn_Newton;
  p_Var1->ops->setctestfn = SUNNonlinSolSetConvTestFn_Newton;
  p_Var1->ops->setmaxiters = SUNNonlinSolSetMaxIters_Newton;
  p_Var1->ops->getnumiters = SUNNonlinSolGetNumIters_Newton;
  p_Var1->ops->getcuriter = SUNNonlinSolGetCurIter_Newton;
  p_Var1->ops->getnumconvfails = SUNNonlinSolGetNumConvFails_Newton;
  __s = (undefined8 *)malloc(0x50);
  memset(__s,0,0x50);
  p_Var1->content = __s;
  *__s = 0;
  __s[1] = 0;
  __s[2] = 0;
  __s[3] = 0;
  *(undefined4 *)(__s + 5) = 0;
  *(undefined4 *)((long)__s + 0x2c) = 0;
  *(undefined4 *)(__s + 6) = 3;
  __s[7] = 0;
  __s[8] = 0;
  __s[9] = 0;
  uVar2 = N_VClone(in_RDI);
  __s[4] = uVar2;
  return p_Var1;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_Newton(N_Vector y, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNNonlinearSolver NLS;
  SUNNonlinearSolverContent_Newton content;

  /* Check that the supplied N_Vector supports all required operations */
  SUNAssertNull(y->ops->nvclone && y->ops->nvdestroy && y->ops->nvscale &&
                  y->ops->nvlinearsum,
                SUN_ERR_ARG_INCOMPATIBLE);

  /* Create an empty nonlinear linear solver object */
  NLS = SUNNonlinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  NLS->ops->gettype         = SUNNonlinSolGetType_Newton;
  NLS->ops->initialize      = SUNNonlinSolInitialize_Newton;
  NLS->ops->solve           = SUNNonlinSolSolve_Newton;
  NLS->ops->free            = SUNNonlinSolFree_Newton;
  NLS->ops->setsysfn        = SUNNonlinSolSetSysFn_Newton;
  NLS->ops->setlsetupfn     = SUNNonlinSolSetLSetupFn_Newton;
  NLS->ops->setlsolvefn     = SUNNonlinSolSetLSolveFn_Newton;
  NLS->ops->setctestfn      = SUNNonlinSolSetConvTestFn_Newton;
  NLS->ops->setmaxiters     = SUNNonlinSolSetMaxIters_Newton;
  NLS->ops->getnumiters     = SUNNonlinSolGetNumIters_Newton;
  NLS->ops->getcuriter      = SUNNonlinSolGetCurIter_Newton;
  NLS->ops->getnumconvfails = SUNNonlinSolGetNumConvFails_Newton;

  /* Create content */
  content = NULL;
  content = (SUNNonlinearSolverContent_Newton)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Initialize all components of content to 0/NULL */
  memset(content, 0, sizeof(struct _SUNNonlinearSolverContent_Newton));

  /* Attach content */
  NLS->content = content;

  /* Fill general content */
  content->Sys        = NULL;
  content->LSetup     = NULL;
  content->LSolve     = NULL;
  content->CTest      = NULL;
  content->jcur       = SUNFALSE;
  content->curiter    = 0;
  content->maxiters   = 3;
  content->niters     = 0;
  content->nconvfails = 0;
  content->ctest_data = NULL;

  /* Fill allocatable content */
  content->delta = N_VClone(y);
  SUNCheckLastErrNull();

  return (NLS);
}